

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall cppcms::json::variant::destroy(variant *this)

{
  string *this_00;
  variant *in_RDI;
  vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *unaff_retaddr;
  
  switch(in_RDI->type) {
  case is_undefined:
  case is_null:
  case is_boolean:
  case is_number:
    break;
  case is_string:
    this_00 = (string *)ptr(in_RDI);
    std::__cxx11::string::~string(this_00);
    break;
  case is_object:
    ptr(in_RDI);
    std::
    map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
    ::~map((map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
            *)0x12388b);
    break;
  case is_array:
    ptr(in_RDI);
    std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::~vector(unaff_retaddr);
  }
  memset(in_RDI,0,0x30);
  return;
}

Assistant:

void destroy()
		{
			typedef std::string string_type;
			switch(type) {
			case is_undefined:
			case is_null:
			case is_boolean:
			case is_number:
				break;
			case is_string:
				static_cast<string_type *>(ptr())->~string_type();
				break;
			case is_object:
				static_cast<object *>(ptr())->~object();
				break;
			case is_array:
				static_cast<array *>(ptr())->~array();
				break;
			}
			memset(&m,0,sizeof(m));
		}